

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  pointer *ppCVar1;
  long lVar2;
  pointer pCVar3;
  iterator __position;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  CigarOp CVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  uint uVar31;
  uint uVar32;
  size_t sVar33;
  long lVar34;
  char *data;
  BamReaderPrivate *this_00;
  ulong uVar35;
  undefined1 uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  char x [32];
  char buffer [4];
  RaiiBuffer allCharData;
  CigarOp local_78;
  uint local_6c;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 local_5c;
  uint32_t local_58;
  undefined8 local_54;
  int32_t local_4c;
  uint local_44;
  RaiiBuffer local_40;
  
  local_44 = 0;
  this_00 = (BamReaderPrivate *)&this->m_stream;
  BgzfStream::Read((BgzfStream *)this_00,(char *)&local_44,4);
  (alignment->SupportData).BlockLength = local_44;
  uVar31 = local_44;
  if (this->m_isBigEndian == true) {
    uVar31 = local_44 >> 0x18 | (local_44 & 0xff0000) >> 8 | (local_44 & 0xff00) << 8 |
             local_44 << 0x18;
    (alignment->SupportData).BlockLength = uVar31;
  }
  if ((uVar31 == 0) ||
     (sVar33 = BgzfStream::Read((BgzfStream *)this_00,(char *)&local_68,0x20), sVar33 != 0x20)) {
    uVar36 = 0;
  }
  else {
    if (this->m_isBigEndian == true) {
      lVar34 = 0;
      do {
        auVar38 = *(undefined1 (*) [16])((long)&local_68 + lVar34 * 4);
        auVar39[1] = 0;
        auVar39[0] = auVar38[8];
        auVar39[2] = auVar38[9];
        auVar39[3] = 0;
        auVar39[4] = auVar38[10];
        auVar39[5] = 0;
        auVar39[6] = auVar38[0xb];
        auVar39[7] = 0;
        auVar39[8] = auVar38[0xc];
        auVar39[9] = 0;
        auVar39[10] = auVar38[0xd];
        auVar39[0xb] = 0;
        auVar39[0xc] = auVar38[0xe];
        auVar39[0xd] = 0;
        auVar39[0xe] = auVar38[0xf];
        auVar39[0xf] = 0;
        auVar39 = pshuflw(auVar39,auVar39,0x1b);
        auVar39 = pshufhw(auVar39,auVar39,0x1b);
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar38._0_13_;
        auVar20[0xe] = auVar38[7];
        auVar21[0xc] = auVar38[6];
        auVar21._0_12_ = auVar38._0_12_;
        auVar21._13_2_ = auVar20._13_2_;
        auVar22[0xb] = 0;
        auVar22._0_11_ = auVar38._0_11_;
        auVar22._12_3_ = auVar21._12_3_;
        auVar23[10] = auVar38[5];
        auVar23._0_10_ = auVar38._0_10_;
        auVar23._11_4_ = auVar22._11_4_;
        auVar24[9] = 0;
        auVar24._0_9_ = auVar38._0_9_;
        auVar24._10_5_ = auVar23._10_5_;
        auVar25[8] = auVar38[4];
        auVar25._0_8_ = auVar38._0_8_;
        auVar25._9_6_ = auVar24._9_6_;
        auVar28._7_8_ = 0;
        auVar28._0_7_ = auVar25._8_7_;
        auVar29._1_8_ = SUB158(auVar28 << 0x40,7);
        auVar29[0] = auVar38[3];
        auVar29._9_6_ = 0;
        auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
        auVar30[0] = auVar38[2];
        auVar30._11_4_ = 0;
        auVar26[2] = auVar38[1];
        auVar26._0_2_ = auVar38._0_2_;
        auVar26._3_12_ = SUB1512(auVar30 << 0x20,3);
        auVar38._0_2_ = auVar38._0_2_ & 0xff;
        auVar38._2_13_ = auVar26._2_13_;
        auVar38[0xf] = 0;
        auVar38 = pshuflw(auVar38,auVar38,0x1b);
        auVar38 = pshufhw(auVar38,auVar38,0x1b);
        sVar4 = auVar38._0_2_;
        sVar5 = auVar38._2_2_;
        sVar6 = auVar38._4_2_;
        sVar7 = auVar38._6_2_;
        sVar8 = auVar38._8_2_;
        sVar9 = auVar38._10_2_;
        sVar10 = auVar38._12_2_;
        sVar11 = auVar38._14_2_;
        sVar12 = auVar39._0_2_;
        sVar13 = auVar39._2_2_;
        sVar14 = auVar39._4_2_;
        sVar15 = auVar39._6_2_;
        sVar16 = auVar39._8_2_;
        sVar17 = auVar39._10_2_;
        sVar18 = auVar39._12_2_;
        sVar19 = auVar39._14_2_;
        lVar2 = lVar34 * 4;
        *(char *)((long)&local_68 + lVar2) =
             (0 < sVar4) * (sVar4 < 0x100) * auVar38[0] - (0xff < sVar4);
        *(char *)((long)&local_68 + lVar2 + 1) =
             (0 < sVar5) * (sVar5 < 0x100) * auVar38[2] - (0xff < sVar5);
        *(char *)((long)&local_68 + lVar2 + 2) =
             (0 < sVar6) * (sVar6 < 0x100) * auVar38[4] - (0xff < sVar6);
        *(char *)((long)&local_68 + lVar2 + 3) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar38[6] - (0xff < sVar7);
        *(char *)((long)&local_68 + lVar2 + 4) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar38[8] - (0xff < sVar8);
        *(char *)((long)&local_68 + lVar2 + 5) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar38[10] - (0xff < sVar9);
        *(char *)((long)&local_68 + lVar2 + 6) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar38[0xc] - (0xff < sVar10);
        *(char *)((long)&local_68 + lVar2 + 7) =
             (0 < sVar11) * (sVar11 < 0x100) * auVar38[0xe] - (0xff < sVar11);
        *(char *)(&local_60 + lVar34) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar39[0] - (0xff < sVar12);
        *(char *)((long)&local_60 + lVar2 + 1) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar39[2] - (0xff < sVar13);
        *(char *)((long)&local_60 + lVar2 + 2) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar39[4] - (0xff < sVar14);
        *(char *)((long)&local_60 + lVar2 + 3) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar39[6] - (0xff < sVar15);
        *(char *)(&local_5c + lVar34) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar39[8] - (0xff < sVar16);
        *(char *)((long)&local_5c + lVar2 + 1) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar39[10] - (0xff < sVar17);
        *(char *)((long)&local_5c + lVar2 + 2) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar39[0xc] - (0xff < sVar18);
        *(char *)((long)&local_5c + lVar2 + 3) =
             (0 < sVar19) * (sVar19 < 0x100) * auVar39[0xe] - (0xff < sVar19);
        lVar34 = lVar34 + 4;
      } while (lVar34 != 8);
    }
    alignment->RefID = (undefined4)local_68;
    alignment->Position = local_68._4_4_;
    alignment->Bin = (uint16_t)(local_60 >> 0x10);
    alignment->MapQuality = (ushort)(local_60 >> 8) & 0xff;
    (alignment->SupportData).QueryNameLength = local_60 & 0xff;
    alignment->AlignmentFlag = local_5c >> 0x10;
    (alignment->SupportData).NumCigarOperations = local_5c & 0xffff;
    (alignment->SupportData).QuerySequenceLength = local_58;
    alignment->MateRefID = (undefined4)local_54;
    alignment->MatePosition = local_54._4_4_;
    alignment->InsertSize = local_4c;
    alignment->Length = local_58;
    uVar35 = (ulong)((alignment->SupportData).BlockLength - 0x20);
    data = (char *)operator_new__(uVar35);
    memset(data,0,uVar35);
    local_40.Buffer = data;
    local_40.NumBytes = uVar35;
    sVar33 = BgzfStream::Read((BgzfStream *)this_00,data,uVar35);
    uVar37 = CONCAT71((int7)((ulong)&local_44 >> 8),sVar33 == uVar35);
    if (sVar33 == uVar35) {
      local_6c = (uint)uVar37;
      Tag2Cigar(this_00,alignment,&local_40);
      std::__cxx11::string::_M_replace
                ((ulong)&alignment->SupportData,0,
                 (char *)(alignment->SupportData).AllCharData._M_string_length,(ulong)data);
      pCVar3 = (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((alignment->CigarData).
          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar3) {
        (alignment->CigarData).
        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar3;
      }
      uVar31 = (alignment->SupportData).QueryNameLength;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                (&alignment->CigarData,(ulong)(alignment->SupportData).NumCigarOperations);
      if ((alignment->SupportData).NumCigarOperations != 0) {
        uVar35 = 0;
        do {
          uVar32 = *(uint *)(data + uVar35 * 4 + (ulong)uVar31);
          if (this->m_isBigEndian == true) {
            uVar32 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                     uVar32 << 0x18;
            *(uint *)(data + uVar35 * 4 + (ulong)uVar31) = uVar32;
          }
          local_78.Length = uVar32 >> 4;
          local_78.Type = "MIDNSHP=X"[uVar32 & 0xf];
          __position._M_current =
               (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (alignment->CigarData).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>>::
            _M_realloc_insert<BamTools::CigarOp_const&>
                      ((vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>> *)
                       &alignment->CigarData,__position,&local_78);
          }
          else {
            CVar27.Length = local_78.Length;
            CVar27.Type = "MIDNSHP=X"[uVar32 & 0xf];
            CVar27._1_3_ = local_78._1_3_;
            *__position._M_current = CVar27;
            ppCVar1 = &(alignment->CigarData).
                       super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < (alignment->SupportData).NumCigarOperations);
      }
      uVar37 = (ulong)local_6c;
    }
    uVar36 = (undefined1)uVar37;
    operator_delete__(data);
  }
  return (bool)uVar36;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment)
{

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    std::fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if (m_isBigEndian) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if (alignment.SupportData.BlockLength == 0) return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if (m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE) return false;

    // swap core endian-ness if necessary
    if (m_isBigEndian) {
        for (unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i += sizeof(uint32_t))
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if (m_stream.Read(allCharData.Buffer, dataLength) == dataLength) {

        int OldNumCigarOperations = alignment.SupportData.NumCigarOperations;
        if (Tag2Cigar(alignment, allCharData)) dataLength -= 8 + OldNumCigarOperations * 4;

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for (unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i) {

            // swap endian-ness if necessary
            if (m_isBigEndian) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type = Constants::BAM_CIGAR_LOOKUP[(cigarData[i] & Constants::BAM_CIGAR_MASK)];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}